

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O2

void __thiscall UEFITool::openImageFile(UEFITool *this,QString *path)

{
  QString *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  char cVar5;
  USTATUS errorCode;
  FfsFinder *pFVar6;
  FfsOperations *pFVar7;
  FfsReport *pFVar8;
  QFile *ctx;
  QArrayDataPointer<char16_t> local_b8;
  QFileInfo fileInfo;
  QByteArray buffer;
  QArrayDataPointer<char16_t> local_78;
  QFile inputFile;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  
  QString::trimmed_helper((QString *)&buffer);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&buffer);
  if (buffer.d.size != 0) {
    QFileInfo::QFileInfo(&fileInfo,(QString *)path);
    cVar5 = QFileInfo::exists();
    if (cVar5 == '\0') {
      pQVar1 = *(QString **)(this->ui + 0x1d8);
      tr((QString *)&buffer,"Please select existing file",(char *)0x0,-1);
      QStatusBar::showMessage(pQVar1,(int)&buffer);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&buffer);
    }
    else {
      QFile::QFile(&inputFile);
      QFile::setFileName((QString *)&inputFile);
      cVar5 = QFile::open(&inputFile,1);
      if (cVar5 == '\0') {
        tr((QString *)&buffer,"Image parsing failed",(char *)0x0,-1);
        tr((QString *)&local_b8,"Can\'t open input file for reading",(char *)0x0,-1);
        QMessageBox::critical(this,&buffer,&local_b8,0x400,0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&buffer);
      }
      else {
        ctx = &inputFile;
        QIODevice::readAll();
        QFileDevice::close();
        init(this,(EVP_PKEY_CTX *)ctx);
        tr((QString *)&local_50,"UEFITool %1 - %2",(char *)0x0,-1);
        QString::arg((QString *)&local_78,(int)&local_50,(QChar)((short)this + L'à'));
        QFileInfo::fileName();
        QString::arg((QString *)&local_b8,(int)&local_78,(QChar)(char16_t)&local_38);
        QWidget::setWindowTitle((QString *)this);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        errorCode = FfsParser::parse(this->ffsParser,&buffer);
        showParserMessages(this);
        if (errorCode == 0) {
          pQVar1 = *(QString **)(this->ui + 0x1d8);
          tr((QString *)&local_78,"Opened: %1",(char *)0x0,-1);
          QFileInfo::fileName();
          QString::arg((QString *)&local_b8,(int)&local_78,(QChar)(char16_t)&local_50);
          QStatusBar::showMessage(pQVar1,(int)&local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          FfsParser::outputInfo(this->ffsParser);
          showFitTable(this);
          showSecurityInfo(this);
          pFVar6 = this->ffsFinder;
          if (pFVar6 != (FfsFinder *)0x0) {
            std::
            vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
            ::~vector(&pFVar6->messagesVector);
          }
          operator_delete(pFVar6,0x20);
          pFVar6 = (FfsFinder *)operator_new(0x20);
          pFVar6->model = this->model;
          (pFVar6->messagesVector).
          super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pFVar6->messagesVector).
          super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pFVar6->messagesVector).
          super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          this->ffsFinder = pFVar6;
          QAction::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x68),0));
          pFVar7 = this->ffsOps;
          if (pFVar7 != (FfsOperations *)0x0) {
            std::
            vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
            ::~vector(&pFVar7->messagesVector);
          }
          operator_delete(pFVar7,0x20);
          pFVar7 = (FfsOperations *)operator_new(0x20);
          pFVar7->model = this->model;
          (pFVar7->messagesVector).
          super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pFVar7->messagesVector).
          super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pFVar7->messagesVector).
          super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          this->ffsOps = pFVar7;
          operator_delete(this->ffsReport,8);
          pFVar8 = (FfsReport *)operator_new(8);
          pFVar8->model = this->model;
          this->ffsReport = pFVar8;
          QAction::setEnabled(SUB81(*(undefined8 *)(this->ui + 0xb0),0));
          if (*(int *)((long)&this->ffsParser->addressDiff + 4) == 0) {
            QAction::setEnabled(SUB81(*(undefined8 *)(this->ui + 0xd0),0));
          }
          QAction::setEnabled(SUB81(*(undefined8 *)(this->ui + 0xe0),0));
          QAction::setEnabled(SUB81(*(undefined8 *)(this->ui + 0xf8),0));
          QFileInfo::absolutePath();
          pDVar3 = (this->currentDir).d.d;
          pcVar4 = (this->currentDir).d.ptr;
          (this->currentDir).d.d = local_b8.d;
          (this->currentDir).d.ptr = local_b8.ptr;
          qVar2 = (this->currentDir).d.size;
          (this->currentDir).d.size = local_b8.size;
          local_b8.d = pDVar3;
          local_b8.ptr = pcVar4;
          local_b8.size = qVar2;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          QString::operator=(&this->currentPath,(QString *)path);
        }
        else {
          tr((QString *)&local_b8,"Image parsing failed",(char *)0x0,-1);
          errorCodeToUString((QString *)&local_78,errorCode);
          QMessageBox::critical(this,&local_b8,&local_78,0x400,0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        }
        QArrayDataPointer<char>::~QArrayDataPointer(&buffer.d);
      }
      QFile::~QFile(&inputFile);
    }
    QFileInfo::~QFileInfo(&fileInfo);
  }
  return;
}

Assistant:

void UEFITool::openImageFile(QString path)
{
    if (path.trimmed().isEmpty())
        return;
    
    QFileInfo fileInfo = QFileInfo(path);
    
    if (!fileInfo.exists()) {
        ui->statusBar->showMessage(tr("Please select existing file"));
        return;
    }
    
    QFile inputFile;
    inputFile.setFileName(path);
    
    if (!inputFile.open(QFile::ReadOnly)) {
        QMessageBox::critical(this, tr("Image parsing failed"), tr("Can't open input file for reading"), QMessageBox::Ok);
        return;
    }
    
    QByteArray buffer = inputFile.readAll();
    inputFile.close();
    
    init();
    setWindowTitle(tr("UEFITool %1 - %2").arg(version).arg(fileInfo.fileName()));
    
    // Parse the image
    USTATUS result = ffsParser->parse(buffer);
    showParserMessages();
    if (result) {
        QMessageBox::critical(this, tr("Image parsing failed"), errorCodeToUString(result), QMessageBox::Ok);
        return;
    }
    else {
        ui->statusBar->showMessage(tr("Opened: %1").arg(fileInfo.fileName()));
    }
    ffsParser->outputInfo();
    
    // Enable or disable FIT tab
    showFitTable();
    
    // Enable or disable Security tab
    showSecurityInfo();
    
    // Enable search ...
    delete ffsFinder;
    ffsFinder = new FfsFinder(model);
    ui->actionSearch->setEnabled(true);
    // ... and other operations
    delete ffsOps;
    ffsOps = new FfsOperations(model);
    // ... and reports
    delete ffsReport;
    ffsReport = new FfsReport(model);
    
    // Enable goToBase and goToAddress
    ui->actionGoToBase->setEnabled(true);
    if (ffsParser->getAddressDiff() <= 0xFFFFFFFFUL)
        ui->actionGoToAddress->setEnabled(true);
    
    // Enable generateReport
    ui->actionGenerateReport->setEnabled(true);
    
    // Enable saving GUIDs
    ui->actionExportDiscoveredGuids->setEnabled(true);
    
    // Set current directory
    currentDir = fileInfo.absolutePath();
    
    // Set current path
    currentPath = path;
}